

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

void curl_easy_reset(Curl_easy *data)

{
  int *piVar1;
  
  Curl_free_request_state(data);
  Curl_freeset(data);
  memset(&data->set,0,0x908);
  Curl_init_userdefined(data);
  memset(&data->progress,0,0x198);
  Curl_initinfo(data);
  piVar1 = &(data->progress).flags;
  *(byte *)piVar1 = (byte)*piVar1 | 0x10;
  (data->state).current_speed = -1;
  (data->state).authhost.want = 0;
  (data->state).authhost.picked = 0;
  (data->state).authhost.avail = 0;
  (data->state).authhost.done = false;
  (data->state).authhost.multipass = false;
  (data->state).authhost.iestyle = false;
  *(undefined5 *)&(data->state).authhost.field_0x1b = 0;
  (data->state).authproxy.want = 0;
  (data->state).authproxy.picked = 0;
  (data->state).authproxy.avail = 0;
  (data->state).authproxy.done = false;
  (data->state).authproxy.multipass = false;
  (data->state).authproxy.iestyle = false;
  *(undefined5 *)&(data->state).authproxy.field_0x1b = 0;
  Curl_digest_cleanup(data);
  return;
}

Assistant:

void curl_easy_reset(struct Curl_easy *data)
{
  Curl_free_request_state(data);

  /* zero out UserDefined data: */
  Curl_freeset(data);
  memset(&data->set, 0, sizeof(struct UserDefined));
  (void)Curl_init_userdefined(data);

  /* zero out Progress data: */
  memset(&data->progress, 0, sizeof(struct Progress));

  /* zero out PureInfo data: */
  Curl_initinfo(data);

  data->progress.flags |= PGRS_HIDE;
  data->state.current_speed = -1; /* init to negative == impossible */

  /* zero out authentication data: */
  memset(&data->state.authhost, 0, sizeof(struct auth));
  memset(&data->state.authproxy, 0, sizeof(struct auth));
  Curl_digest_cleanup(data);
}